

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

void ngx_unescape_uri(u_char **dst,u_char **src,size_t size,ngx_uint_t type)

{
  byte bVar1;
  byte bVar2;
  ngx_uint_t nVar3;
  byte *pbVar4;
  int local_40;
  char local_3b;
  anon_enum_32 state;
  u_char decoded;
  u_char c;
  u_char ch;
  u_char *s;
  u_char *d;
  ngx_uint_t type_local;
  size_t size_local;
  u_char **src_local;
  u_char **dst_local;
  
  local_40 = 0;
  local_3b = '\0';
  pbVar4 = *src;
  s = *dst;
  type_local = size;
LAB_0011e055:
  do {
    _state = pbVar4;
    nVar3 = type_local - 1;
    if (type_local == 0) {
LAB_0011e392:
      *dst = s;
      *src = _state;
      return;
    }
    pbVar4 = _state + 1;
    bVar2 = *_state;
    type_local = nVar3;
    if (local_40 != 0) {
      if (local_40 == 1) {
        if ((bVar2 < 0x30) || (0x39 < bVar2)) {
          bVar1 = bVar2 | 0x20;
          if ((bVar1 < 0x61) || (0x66 < bVar1)) {
            local_40 = 0;
            *s = bVar2;
            s = s + 1;
          }
          else {
            local_3b = bVar1 + 0xa9;
            local_40 = 2;
          }
        }
        else {
          local_3b = bVar2 - 0x30;
          local_40 = 2;
        }
      }
      else if (local_40 == 2) {
        local_40 = 0;
        if ((bVar2 < 0x30) || (0x39 < bVar2)) {
          bVar2 = bVar2 | 0x20;
          if ((0x60 < bVar2) && (bVar2 < 0x67)) {
            bVar2 = local_3b * '\x10' + bVar2 + 0xa9;
            if ((type & 1) == 0) {
              if ((type & 2) == 0) {
                *s = bVar2;
                s = s + 1;
              }
              else {
                if (bVar2 == 0x3f) {
                  *s = '?';
                  _state = pbVar4;
                  s = s + 1;
                  goto LAB_0011e392;
                }
                if ((bVar2 < 0x26) || (0x7e < bVar2)) {
                  *s = '%';
                  s[1] = _state[-1];
                  s[2] = *_state;
                  s = s + 3;
                }
                else {
                  *s = bVar2;
                  s = s + 1;
                }
              }
            }
            else {
              if (bVar2 == 0x3f) {
                *s = '?';
                _state = pbVar4;
                s = s + 1;
                goto LAB_0011e392;
              }
              *s = bVar2;
              s = s + 1;
            }
          }
        }
        else {
          bVar2 = (local_3b * '\x10' + bVar2) - 0x30;
          if ((type & 2) == 0) {
            *s = bVar2;
            s = s + 1;
          }
          else if ((bVar2 < 0x26) || (0x7e < bVar2)) {
            *s = '%';
            s[1] = _state[-1];
            s[2] = *_state;
            s = s + 3;
          }
          else {
            *s = bVar2;
            s = s + 1;
          }
        }
      }
      goto LAB_0011e055;
    }
    if ((bVar2 == 0x3f) && ((type & 3) != 0)) {
      *s = '?';
      _state = pbVar4;
      s = s + 1;
      goto LAB_0011e392;
    }
    if (bVar2 == 0x25) {
      local_40 = 1;
    }
    else {
      *s = bVar2;
      s = s + 1;
    }
  } while( true );
}

Assistant:

void
ngx_unescape_uri(u_char **dst, u_char **src, size_t size, ngx_uint_t type)
{
    u_char  *d, *s, ch, c, decoded;
    enum {
        sw_usual = 0,
        sw_quoted,
        sw_quoted_second
    } state;

    d = *dst;
    s = *src;

    state = 0;
    decoded = 0;

    while (size--) {

        ch = *s++;

        switch (state) {
        case sw_usual:
            if (ch == '?'
                && (type & (NGX_UNESCAPE_URI|NGX_UNESCAPE_REDIRECT)))
            {
                *d++ = ch;
                goto done;
            }

            if (ch == '%') {
                state = sw_quoted;
                break;
            }

            *d++ = ch;
            break;

        case sw_quoted:

            if (ch >= '0' && ch <= '9') {
                decoded = (u_char) (ch - '0');
                state = sw_quoted_second;
                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                decoded = (u_char) (c - 'a' + 10);
                state = sw_quoted_second;
                break;
            }

            /* the invalid quoted character */

            state = sw_usual;

            *d++ = ch;

            break;

        case sw_quoted_second:

            state = sw_usual;

            if (ch >= '0' && ch <= '9') {
                ch = (u_char) ((decoded << 4) + ch - '0');

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);

                    break;
                }

                *d++ = ch;

                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                ch = (u_char) ((decoded << 4) + c - 'a' + 10);

                if (type & NGX_UNESCAPE_URI) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    *d++ = ch;
                    break;
                }

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);
                    break;
                }

                *d++ = ch;

                break;
            }

            /* the invalid quoted character */

            break;
        }
    }

done:

    *dst = d;
    *src = s;
}